

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

path * lookup_file_insensitive
                 (path *__return_storage_ptr__,path *path,string *filename,string *error_msg)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  path *ppVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  path *__p;
  undefined8 uVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  directory_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  error_code ec;
  directory_iterator di;
  string local_158;
  directory_iterator local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  directory_iterator local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  path local_f8;
  path *local_d0;
  string *local_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  error_code local_a0;
  long *local_90 [2];
  long local_80 [2];
  string *local_70;
  path *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  directory_iterator local_40;
  
  local_a0._M_value = 0;
  local_d0 = __return_storage_ptr__;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_40,path,none,&local_a0);
  if (local_a0._M_value == 0) {
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              (&local_118,path,none,(error_code *)0x0);
    if (local_118._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_138._M_dir._M_ptr = local_118._M_dir._M_ptr;
      local_138._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        local_138._M_dir._M_ptr = local_118._M_dir._M_ptr;
        local_138._M_dir._M_refcount._M_pi = local_118._M_dir._M_refcount._M_pi;
        if (local_118._M_dir._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010f559;
      }
      else {
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      }
      local_138._M_dir._M_ptr = local_118._M_dir._M_ptr;
      local_138._M_dir._M_refcount._M_pi = local_118._M_dir._M_refcount._M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118._M_dir._M_refcount._M_pi)->_M_use_count =
             (local_118._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118._M_dir._M_refcount._M_pi);
    }
LAB_0010f559:
    local_c8 = filename;
    local_70 = error_msg;
    local_68 = path;
    while (local_138._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
          ) {
      ppVar9 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_138);
      sVar3 = (ppVar9->_M_pathname)._M_string_length;
      if (sVar3 == 0) {
LAB_0010f5f4:
        std::filesystem::__cxx11::path::path(&local_f8);
      }
      else {
        uVar15 = *(ulong *)&ppVar9->_M_cmpts;
        uVar6 = (uint)uVar15;
        __p = ppVar9;
        if ((~(byte)uVar15 & 3) != 0) {
          if (((uVar15 & 3) == 0) && ((ppVar9->_M_pathname)._M_dataplus._M_p[sVar3 - 1] != '/')) {
            if ((uVar15 & 3) == 0) {
              lVar10 = std::filesystem::__cxx11::path::_List::end();
              __p = (path *)(lVar10 + -0x30);
              if ((*(ulong *)&ppVar9->_M_cmpts & 3) != 0) {
                __p = ppVar9;
              }
              uVar6 = (uint)*(undefined8 *)&__p->_M_cmpts;
            }
            if ((~uVar6 & 3) == 0) goto LAB_0010f5ea;
          }
          goto LAB_0010f5f4;
        }
LAB_0010f5ea:
        std::filesystem::__cxx11::path::path(&local_f8,__p);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,local_f8._M_pathname._M_dataplus._M_p,
                 local_f8._M_pathname._M_dataplus._M_p + local_f8._M_pathname._M_string_length);
      bVar5 = compare_string_insensitive(&local_158,local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_f8);
      if (bVar5) {
        std::filesystem::__cxx11::path::path(local_d0,ppVar9);
        if (local_138._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138._M_dir._M_refcount._M_pi);
        }
        ppVar9 = local_d0;
        if (local_118._M_dir._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118._M_dir._M_refcount._M_pi);
        }
        goto LAB_0010f881;
      }
      std::filesystem::__cxx11::directory_iterator::operator++(&local_138);
    }
    if (local_118._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118._M_dir._M_refcount._M_pi);
    }
    pcVar1 = (local_c8->_M_dataplus)._M_p;
    local_118._M_dir._M_ptr = (element_type *)&local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + local_c8->_M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    pcVar1 = (local_68->_M_pathname)._M_dataplus._M_p;
    local_138._M_dir._M_ptr = (element_type *)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,pcVar1,pcVar1 + (local_68->_M_pathname)._M_string_length);
    uVar15 = (long)&(local_118._M_dir._M_refcount._M_pi)->_vptr__Sp_counted_base +
             (long)&(local_138._M_dir._M_refcount._M_pi)->_vptr__Sp_counted_base;
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr != &local_108) {
      uVar14 = local_108._M_allocated_capacity;
    }
    if ((ulong)uVar14 < uVar15) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dir._M_ptr != &local_128) {
        uVar14 = local_128._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar15) goto LAB_0010f712;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_138,0,(char *)0x0,(ulong)local_118._M_dir._M_ptr);
    }
    else {
LAB_0010f712:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_138._M_dir._M_ptr);
    }
    puVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_158.field_2._M_allocated_capacity = *puVar12;
      local_158.field_2._8_8_ = puVar8[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar12;
      local_158._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_158._M_string_length = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
    paVar11 = &local_f8._M_pathname.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar13) {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f8._M_pathname.field_2._8_8_ = plVar7[3];
      local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f8._M_pathname._M_string_length = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar11) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    ppVar9 = local_d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dir._M_ptr != &local_128) {
      operator_delete(local_138._M_dir._M_ptr,local_128._M_allocated_capacity + 1);
    }
    uVar14 = local_108._M_allocated_capacity;
    _Var16._M_p = (pointer)local_118._M_dir._M_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr == &local_108) goto LAB_0010f879;
  }
  else {
    std::operator+(&local_60,"Error looking up \'",filename);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_138._M_dir._M_ptr = (element_type *)&local_128;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar11) {
      local_128._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_128._8_4_ = (undefined4)plVar7[3];
      local_128._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    }
    else {
      local_128._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_138._M_dir._M_ptr = (element_type *)*plVar7;
    }
    local_138._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pcVar1 = (path->_M_pathname)._M_dataplus._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,pcVar1,pcVar1 + (path->_M_pathname)._M_string_length);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar11) {
      local_108._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_108._8_8_ = plVar7[3];
      local_118._M_dir._M_ptr = (element_type *)&local_108;
    }
    else {
      local_108._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_118._M_dir._M_ptr = (element_type *)*plVar7;
    }
    local_118._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    paVar11 = &local_158.field_2;
    puVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_158.field_2._M_allocated_capacity = *puVar12;
      local_158.field_2._8_8_ = puVar8[3];
      local_158._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar12;
      local_158._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_158._M_string_length = puVar8[1];
    *puVar8 = puVar12;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_c0,local_a0._M_cat,local_a0._M_value);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar11) {
      uVar14 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_b8 + local_158._M_string_length) {
      uVar15 = 0xf;
      if (local_c0 != local_b0) {
        uVar15 = local_b0[0];
      }
      if (uVar15 < local_b8 + local_158._M_string_length) goto LAB_0010f34f;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
    }
    else {
LAB_0010f34f:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_c0);
    }
    local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar13) {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f8._M_pathname.field_2._8_8_ = puVar8[3];
    }
    else {
      local_f8._M_pathname.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f8._M_pathname._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_f8._M_pathname._M_string_length = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_f8);
    paVar13 = &local_f8._M_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != paVar13) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar11) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dir._M_ptr != &local_108) {
      operator_delete(local_118._M_dir._M_ptr,local_108._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dir._M_ptr != &local_128) {
      operator_delete(local_138._M_dir._M_ptr,local_128._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (filename->_M_dataplus)._M_p;
    pcVar2 = (path->_M_pathname)._M_dataplus._M_p;
    local_f8._M_pathname._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,pcVar2,pcVar2 + (path->_M_pathname)._M_string_length);
    iVar4 = local_a0._M_value;
    _Var16._M_p = local_f8._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)local_a0._M_cat + 0x20))(&local_158,local_a0._M_cat,local_a0._M_value);
    SDL_LogError(1,"Error looking up \'%s\' in \'%s\': %d - %s",pcVar1,_Var16._M_p,iVar4,
                 local_158._M_dataplus._M_p);
    ppVar9 = local_d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar11) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_f8._M_pathname.field_2._M_allocated_capacity;
    _Var16._M_p = local_f8._M_pathname._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p == paVar13) goto LAB_0010f879;
  }
  operator_delete(_Var16._M_p,uVar14 + 1);
LAB_0010f879:
  std::filesystem::__cxx11::path::path(ppVar9);
LAB_0010f881:
  if (local_40._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_dir._M_refcount._M_pi)
    ;
  }
  return ppVar9;
}

Assistant:

filesystem::path lookup_file_insensitive(const filesystem::path &path, const std::string &filename, std::string &error_msg) {
	std::error_code ec;
	filesystem::directory_iterator di{path, ec};

	if (ec) {
		error_msg = "Error looking up '" + filename + "' in '" + path.string().c_str() + "': " + ec.message();
		SDL_LogError(SDL_LOG_CATEGORY_ERROR, "Error looking up '%s' in '%s': %d - %s", filename.c_str(), path.string().c_str(), ec.value(), ec.message().c_str());
		return {};
	}

	for(auto& p: filesystem::directory_iterator(path)) {
		if (compare_string_insensitive(p.path().filename().string(), filename)) {
			return p.path();
		}
	}
	error_msg = filename + ": file not found in '" + path.string() + "'.";
	return {};
}